

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O1

void __thiscall soplex::SoPlexBase<double>::Settings::BoolParam::BoolParam(BoolParam *this)

{
  long lVar1;
  
  lVar1 = 0x10;
  do {
    *(long *)((long)this->name + lVar1 + -0x10) = (long)&this->name[0]._M_dataplus._M_p + lVar1;
    *(undefined8 *)((long)this->name + lVar1 + -8) = 0;
    *(undefined1 *)((long)&this->name[0]._M_dataplus._M_p + lVar1) = 0;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x350);
  lVar1 = 0x350;
  do {
    *(long *)((long)this->name + lVar1 + -0x10) = (long)&this->name[0]._M_dataplus._M_p + lVar1;
    *(undefined8 *)((long)this->name + lVar1 + -8) = 0;
    *(undefined1 *)((long)&this->name[0]._M_dataplus._M_p + lVar1) = 0;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x690);
  std::__cxx11::string::_M_replace((ulong)this,0,(char *)this->name[0]._M_string_length,0x61021d);
  std::__cxx11::string::_M_replace
            ((ulong)this->description,0,(char *)this->description[0]._M_string_length,0x610225);
  this->defaultValue[0] = false;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 1),0,(char *)this->name[1]._M_string_length,0x61026c);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 1),0,(char *)this->description[1]._M_string_length,0x610274
            );
  this->defaultValue[1] = false;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 2),0,(char *)this->name[2]._M_string_length,0x6102b7);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 2),0,(char *)this->description[2]._M_string_length,0x6102c3
            );
  this->defaultValue[2] = false;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 3),0,(char *)this->name[3]._M_string_length,0x61032c);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 3),0,(char *)this->description[3]._M_string_length,0x610333
            );
  this->defaultValue[3] = true;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 4),0,(char *)this->name[4]._M_string_length,0x61037c);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 4),0,(char *)this->description[4]._M_string_length,0x61038a
            );
  this->defaultValue[4] = false;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 5),0,(char *)this->name[5]._M_string_length,0x6103cc);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 5),0,(char *)this->description[5]._M_string_length,0x6103d3
            );
  this->defaultValue[5] = true;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 6),0,(char *)this->name[6]._M_string_length,0x610412);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 6),0,(char *)this->description[6]._M_string_length,0x61041f
            );
  this->defaultValue[6] = true;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 7),0,(char *)this->name[7]._M_string_length,0x610460);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 7),0,(char *)this->description[7]._M_string_length,0x61046b
            );
  this->defaultValue[7] = false;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 8),0,(char *)this->name[8]._M_string_length,0x6104b3);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 8),0,(char *)this->description[8]._M_string_length,0x6104c1
            );
  this->defaultValue[8] = false;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 9),0,(char *)this->name[9]._M_string_length,0x6104f1);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 9),0,(char *)this->description[9]._M_string_length,0x610503
            );
  this->defaultValue[9] = true;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 10),0,(char *)this->name[10]._M_string_length,0x610526);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 10),0,(char *)this->description[10]._M_string_length,
             0x610537);
  this->defaultValue[10] = false;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 0xb),0,(char *)this->name[0xb]._M_string_length,0x61056d);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 0xb),0,(char *)this->description[0xb]._M_string_length,
             0x610577);
  this->defaultValue[0xb] = false;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 0xc),0,(char *)this->name[0xc]._M_string_length,0x6105cd);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 0xc),0,(char *)this->description[0xc]._M_string_length,
             0x6105d8);
  this->defaultValue[0xc] = false;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 0xd),0,(char *)this->name[0xd]._M_string_length,0x610615);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 0xd),0,(char *)this->description[0xd]._M_string_length,
             0x610635);
  this->defaultValue[0xd] = true;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 0xe),0,(char *)this->name[0xe]._M_string_length,0x61065e);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 0xe),0,(char *)this->description[0xe]._M_string_length,
             0x61067c);
  this->defaultValue[0xe] = true;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 0xf),0,(char *)this->name[0xf]._M_string_length,0x6106ad);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 0xf),0,(char *)this->description[0xf]._M_string_length,
             0x6106cc);
  this->defaultValue[0xf] = true;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 0x10),0,(char *)this->name[0x10]._M_string_length,0x6106fc);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 0x10),0,(char *)this->description[0x10]._M_string_length,
             0x61071b);
  this->defaultValue[0x10] = true;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 0x11),0,(char *)this->name[0x11]._M_string_length,0x61074b);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 0x11),0,(char *)this->description[0x11]._M_string_length,
             0x610766);
  this->defaultValue[0x11] = true;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 0x12),0,(char *)this->name[0x12]._M_string_length,0x610793);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 0x12),0,(char *)this->description[0x12]._M_string_length,
             0x6107ad);
  this->defaultValue[0x12] = true;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 0x13),0,(char *)this->name[0x13]._M_string_length,0x6107d0);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 0x13),0,(char *)this->description[0x13]._M_string_length,
             0x6107f0);
  this->defaultValue[0x13] = true;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 0x14),0,(char *)this->name[0x14]._M_string_length,0x610819);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 0x14),0,(char *)this->description[0x14]._M_string_length,
             0x610832);
  this->defaultValue[0x14] = true;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 0x15),0,(char *)this->name[0x15]._M_string_length,0x61085b);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 0x15),0,(char *)this->description[0x15]._M_string_length,
             0x610870);
  this->defaultValue[0x15] = true;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 0x16),0,(char *)this->name[0x16]._M_string_length,0x61088c);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 0x16),0,(char *)this->description[0x16]._M_string_length,
             0x6108a9);
  this->defaultValue[0x16] = false;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 0x17),0,(char *)this->name[0x17]._M_string_length,0x6108d5);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 0x17),0,(char *)this->description[0x17]._M_string_length,
             0x6108e8);
  this->defaultValue[0x17] = false;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 0x18),0,(char *)this->name[0x18]._M_string_length,0x610902);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 0x18),0,(char *)this->description[0x18]._M_string_length,
             0x610915);
  this->defaultValue[0x18] = true;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 0x19),0,(char *)this->name[0x19]._M_string_length,0x610960);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 0x19),0,(char *)this->description[0x19]._M_string_length,
             0x610973);
  this->defaultValue[0x19] = false;
  return;
}

Assistant:

SoPlexBase<R>::Settings::BoolParam::BoolParam()
{
   // should lifting be used to reduce range of nonzero matrix coefficients?
   name[SoPlexBase<R>::LIFTING] = "lifting";
   description[SoPlexBase<R>::LIFTING] =
      "should lifting be used to reduce range of nonzero matrix coefficients?";
   defaultValue[SoPlexBase<R>::LIFTING] = false;

   // should LP be transformed to equality form before a rational solve?
   name[SoPlexBase<R>::EQTRANS] = "eqtrans";
   description[SoPlexBase<R>::EQTRANS] =
      "should LP be transformed to equality form before a rational solve?";
   defaultValue[SoPlexBase<R>::EQTRANS] = false;

   // should dual infeasibility be tested in order to try to return a dual solution even if primal infeasible?
   name[SoPlexBase<R>::TESTDUALINF] = "testdualinf";
   description[SoPlexBase<R>::TESTDUALINF] =
      "should dual infeasibility be tested in order to try to return a dual solution even if primal infeasible?";
   defaultValue[SoPlexBase<R>::TESTDUALINF] = false;

   // should a rational factorization be performed after iterative refinement?
   name[SoPlexBase<R>::RATFAC] = "ratfac";
   description[SoPlexBase<R>::RATFAC] =
      "should a rational factorization be performed after iterative refinement?";
   defaultValue[SoPlexBase<R>::RATFAC] = true;

   // should cycling solutions be accepted during iterative refinement?
   name[SoPlexBase<R>::ACCEPTCYCLING] = "acceptcycling";
   description[SoPlexBase<R>::ACCEPTCYCLING] =
      "should cycling solutions be accepted during iterative refinement?";
   defaultValue[SoPlexBase<R>::ACCEPTCYCLING] = false;

   // apply rational reconstruction after each iterative refinement?
   name[SoPlexBase<R>::RATREC] = "ratrec";
   description[SoPlexBase<R>::RATREC] =
      "apply rational reconstruction after each iterative refinement?";
   defaultValue[SoPlexBase<R>::RATREC] = true;

   // round scaling factors for iterative refinement to powers of two?
   name[SoPlexBase<R>::POWERSCALING] = "powerscaling";
   description[SoPlexBase<R>::POWERSCALING] =
      "round scaling factors for iterative refinement to powers of two?";
   defaultValue[SoPlexBase<R>::POWERSCALING] = true;

   // continue iterative refinement with exact basic solution if not optimal?
   name[SoPlexBase<R>::RATFACJUMP] = "ratfacjump";
   description[SoPlexBase<R>::RATFACJUMP] =
      "continue iterative refinement with exact basic solution if not optimal?";
   defaultValue[SoPlexBase<R>::RATFACJUMP] = false;

   // use bound flipping also for row representation?
   name[SoPlexBase<R>::ROWBOUNDFLIPS] = "rowboundflips";
   description[SoPlexBase<R>::ROWBOUNDFLIPS] = "use bound flipping also for row representation?";
   defaultValue[SoPlexBase<R>::ROWBOUNDFLIPS] = false;

   // use persistent scaling?
   name[SoPlexBase<R>::PERSISTENTSCALING] = "persistentscaling";
   description[SoPlexBase<R>::PERSISTENTSCALING] = "should persistent scaling be used?";
   defaultValue[SoPlexBase<R>::PERSISTENTSCALING] = true;

   // perturb the entire problem or only the relevant bounds of s single pivot?
   name[SoPlexBase<R>::FULLPERTURBATION] = "fullperturbation";
   description[SoPlexBase<R>::FULLPERTURBATION] =
      "should perturbation be applied to the entire problem?";
   defaultValue[SoPlexBase<R>::FULLPERTURBATION] = false;

   /// re-optimize the original problem to get a proof of infeasibility/unboundedness?
   name[SoPlexBase<R>::ENSURERAY] = "ensureray";
   description[SoPlexBase<R>::ENSURERAY] =
      "re-optimize the original problem to get a proof (ray) of infeasibility/unboundedness?";
   defaultValue[SoPlexBase<R>::ENSURERAY] = false;

   /// try to enforce that the optimal solution is a basic solution
   name[SoPlexBase<Real>::FORCEBASIC] = "forcebasic";
   description[SoPlexBase<Real>::FORCEBASIC] =
      "try to enforce that the optimal solution is a basic solution";
   defaultValue[SoPlexBase<Real>::FORCEBASIC] = false;

   name[SoPlexBase<R>::SIMPLIFIER_SINGLETONCOLS] = "simplifier_enable_singletoncols";
   description[SoPlexBase<R>::SIMPLIFIER_SINGLETONCOLS] =
      "enable presolver SingletonCols in PaPILO";
   defaultValue[SoPlexBase<R>::SIMPLIFIER_SINGLETONCOLS] = true;

   name[SoPlexBase<R>::SIMPLIFIER_CONSTRAINTPROPAGATION] = "simplifier_enable_propagation";
   description[SoPlexBase<R>::SIMPLIFIER_CONSTRAINTPROPAGATION] =
      "enable presolver ConstraintPropagation in PaPILO";
   defaultValue[SoPlexBase<R>::SIMPLIFIER_CONSTRAINTPROPAGATION] = true;

   name[SoPlexBase<R>::SIMPLIFIER_PARALLELROWDETECTION] = "simplifier_enable_parallelrows";
   description[SoPlexBase<R>::SIMPLIFIER_PARALLELROWDETECTION] =
      "enable presolver ParallelRowDetection in PaPILO";
   defaultValue[SoPlexBase<R>::SIMPLIFIER_PARALLELROWDETECTION] = true;

   name[SoPlexBase<R>::SIMPLIFIER_PARALLELCOLDETECTION] = "simplifier_enable_parallelcols";
   description[SoPlexBase<R>::SIMPLIFIER_PARALLELCOLDETECTION] =
      "enable presolver ParallelColDetection in PaPILO";
   defaultValue[SoPlexBase<R>::SIMPLIFIER_PARALLELCOLDETECTION] = true;

   name[SoPlexBase<R>::SIMPLIFIER_SINGLETONSTUFFING] = "simplifier_enable_stuffing";
   description[SoPlexBase<R>::SIMPLIFIER_SINGLETONSTUFFING] =
      "enable presolver SingletonStuffing in PaPILO";
   defaultValue[SoPlexBase<R>::SIMPLIFIER_SINGLETONSTUFFING] = true;

   name[SoPlexBase<R>::SIMPLIFIER_DUALFIX] = "simplifier_enable_dualfix";
   description[SoPlexBase<R>::SIMPLIFIER_DUALFIX] =
      "enable presolver DualFix in PaPILO";
   defaultValue[SoPlexBase<R>::SIMPLIFIER_DUALFIX] = true;

   name[SoPlexBase<R>::SIMPLIFIER_FIXCONTINUOUS] = "simplifier_enable_fixcontinuous";
   description[SoPlexBase<R>::SIMPLIFIER_FIXCONTINUOUS] =
      "enable presolver FixContinuous in PaPILO";
   defaultValue[SoPlexBase<R>::SIMPLIFIER_FIXCONTINUOUS] = true;

   name[SoPlexBase<R>::SIMPLIFIER_DOMINATEDCOLS] = "simplifier_enable_domcol";
   description[SoPlexBase<R>::SIMPLIFIER_DOMINATEDCOLS] =
      "enable presolver DominatedCols in PaPILO";
   defaultValue[SoPlexBase<R>::SIMPLIFIER_DOMINATEDCOLS] = true;

   name[SoPlexBase<R>::ITERATIVE_REFINEMENT] = "iterative_refinement";
   description[SoPlexBase<R>::ITERATIVE_REFINEMENT] =
      "enable iterative refinement";
   defaultValue[SoPlexBase<R>::ITERATIVE_REFINEMENT] = true;

   // adapt tolerances to the multiprecision used
   name[SoPlexBase<R>::ADAPT_TOLS_TO_MULTIPRECISION] = "adapt_tols_to_multiprecision";
   description[SoPlexBase<R>::ADAPT_TOLS_TO_MULTIPRECISION] =
      "adapt tolerances to the multiprecision used";
   defaultValue[SoPlexBase<R>::ADAPT_TOLS_TO_MULTIPRECISION] = false;

   name[SoPlexBase<R>::PRECISION_BOOSTING] = "precision_boosting";
   description[SoPlexBase<R>::PRECISION_BOOSTING] =
      "enable precision boosting";
#ifdef SOPLEX_WITH_MPFR
   defaultValue[SoPlexBase<R>::PRECISION_BOOSTING] = true;
#else
   defaultValue[SoPlexBase<R>::PRECISION_BOOSTING] = false;
#endif

   name[SoPlexBase<R>::BOOSTED_WARM_START] = "boosted_warm_start";
   description[SoPlexBase<R>::BOOSTED_WARM_START] =
      "if true, boosted solver starts from last basis, otherwise from slack basis";
   defaultValue[SoPlexBase<R>::BOOSTED_WARM_START] = true;

   name[SoPlexBase<R>::RECOVERY_MECHANISM] = "recovery_mechanism";
   description[SoPlexBase<R>::RECOVERY_MECHANISM] =
      "enable recovery mechanism for when the solve fails";
   defaultValue[SoPlexBase<R>::RECOVERY_MECHANISM] = false;
}